

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfEvent.c
# Opt level: O3

void sbfEventQueueCb(sbfQueueItem item,void *closure)

{
  int *piVar1;
  undefined4 *puVar2;
  
  if (*(int *)((long)closure + 0x20) == 0) {
    puVar2 = (undefined4 *)sbfQueue_getItemData(item);
    (**closure)(closure,*puVar2,*(undefined8 *)((long)closure + 8));
  }
  LOCK();
  piVar1 = (int *)((long)closure + 0x24);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free(closure);
    return;
  }
  return;
}

Assistant:

static void
sbfEventQueueCb (sbfQueueItem item, void* closure)
{
    sbfEvent event = closure;
    int      events;

    if (!event->mDestroyed)
    {
        events = *(int*)sbfQueue_getItemData (item);
        event->mCb (event, events, event->mClosure);
    }

    if (sbfRefCount_decrement (&event->mRefCount))
        free (event);
}